

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::hugeint_t,long,duckdb::ArgMinMaxState<duckdb::hugeint_t,long>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::hugeint_t,_long> *state,hugeint_t x_data,long y_data,
          AggregateBinaryInput *binary)

{
  ArgMinMaxBase<duckdb::LessThan,false> AVar1;
  
  if ((**(long **)(y_data + 0x10) != 0) &&
     ((*(ulong *)(**(long **)(y_data + 0x10) + (*(ulong *)(y_data + 0x20) >> 6) * 8) >>
       (*(ulong *)(y_data + 0x20) & 0x3f) & 1) == 0)) {
    return;
  }
  if (*(long *)(this + 0x18) <= x_data.upper) {
    return;
  }
  if (**(long **)(y_data + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    AVar1 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(**(long **)(y_data + 8) + (*(ulong *)(y_data + 0x18) >> 6) * 8) >>
              (*(ulong *)(y_data + 0x18) & 0x3f) & 1) == 0);
    this[1] = AVar1;
    if ((bool)AVar1) goto LAB_004818c8;
  }
  *(ArgMinMaxState<duckdb::hugeint_t,_long> **)(this + 8) = state;
  *(uint64_t *)(this + 0x10) = x_data.lower;
LAB_004818c8:
  *(int64_t *)(this + 0x18) = x_data.upper;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}